

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

void __thiscall kratos::GeneratorGraph::GeneratorGraph(GeneratorGraph *this,Generator *generator)

{
  undefined1 local_c8 [8];
  GeneratorGraphVisitor g_visitor;
  undefined1 local_68 [8];
  GeneratorVisitor visitor;
  Generator *generator_local;
  GeneratorGraph *this_local;
  
  visitor.g_ = (GeneratorGraph *)generator;
  std::
  unordered_map<kratos::Generator_*,_kratos::GeneratorNode,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>_>
  ::unordered_map(&this->nodes_);
  this->root_ = (Generator *)visitor.g_;
  GeneratorVisitor::GeneratorVisitor((GeneratorVisitor *)local_68,this);
  IRVisitor::visit_generator_root((IRVisitor *)local_68,(Generator *)visitor.g_);
  GeneratorGraphVisitor::GeneratorGraphVisitor((GeneratorGraphVisitor *)local_c8,this);
  IRVisitor::visit_generator_root((IRVisitor *)local_c8,(Generator *)visitor.g_);
  GeneratorGraphVisitor::~GeneratorGraphVisitor((GeneratorGraphVisitor *)local_c8);
  GeneratorVisitor::~GeneratorVisitor((GeneratorVisitor *)local_68);
  return;
}

Assistant:

GeneratorGraph::GeneratorGraph(Generator *generator) : root_(generator) {
    // first pass create nodes for each generator
    GeneratorVisitor visitor(this);
    visitor.visit_generator_root(generator);
    // second pass to build the graph
    GeneratorGraphVisitor g_visitor(this);
    g_visitor.visit_generator_root(generator);
}